

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_scale(Integer s_a,void *scale)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  double dVar8;
  _sparse_array *p_Var9;
  Integer IVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  Integer s_lo;
  void *vptr;
  Integer s_hi;
  int local_3c;
  Integer ld;
  
  lVar11 = s_a + 1000;
  IVar10 = pnga_pgroup_nodeid(SPA[s_a + 1000].grp);
  bVar12 = _ga_sync_begin != 0;
  local_3c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar12) {
    pnga_pgroup_sync(SPA[lVar11].grp);
  }
  pnga_distribution(SPA[lVar11].g_data,IVar10,&s_lo,&s_hi);
  pnga_access_ptr(SPA[lVar11].g_data,&s_lo,&s_hi,&vptr,&ld);
  p_Var9 = SPA;
  switch(SPA[lVar11].type) {
  case 0x3e9:
    iVar5 = *scale;
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      *(int *)vptr = *vptr * iVar5;
      vptr = (void *)((long)vptr + 4);
    }
    break;
  case 0x3ea:
    lVar6 = *scale;
    for (IVar10 = s_lo; IVar10 <= s_hi; IVar10 = IVar10 + 1) {
      *(long *)((long)vptr + IVar10 * 8 + s_lo * -8) =
           *(long *)((long)vptr + IVar10 * 8 + s_lo * -8) * lVar6;
    }
    break;
  case 0x3eb:
    fVar1 = *scale;
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      *(float *)vptr = *vptr * fVar1;
      vptr = (void *)((long)vptr + 4);
    }
    break;
  case 0x3ec:
    dVar3 = *scale;
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      *(double *)vptr = *vptr * dVar3;
      vptr = (void *)((long)vptr + 8);
    }
    break;
  case 0x3ee:
    fVar1 = *scale;
    fVar2 = *(float *)((long)scale + 4);
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      fVar13 = (float)*vptr;
      fVar14 = (float)((ulong)*vptr >> 0x20);
      *(ulong *)vptr = CONCAT44(fVar14 * fVar1 + fVar13 * fVar2,fVar13 * fVar1 + fVar14 * -fVar2);
      vptr = (void *)((long)vptr + 8);
    }
    break;
  case 0x3ef:
    dVar3 = *scale;
    dVar4 = *(double *)((long)scale + 8);
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      dVar8 = *(double *)(*(undefined1 (*) [16])vptr + 8) * dVar3 +
              *(double *)*(undefined1 (*) [16])vptr * dVar4;
      auVar7._8_4_ = SUB84(dVar8,0);
      auVar7._0_8_ = *(double *)*(undefined1 (*) [16])vptr * dVar3 +
                     *(double *)(*(undefined1 (*) [16])vptr + 8) * -dVar4;
      auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *(undefined1 (*) [16])vptr = auVar7;
      vptr = (void *)((long)vptr + 0x10);
    }
    break;
  case 0x3f8:
    lVar6 = *scale;
    for (; s_lo <= s_hi; s_lo = s_lo + 1) {
      *(long *)vptr = *vptr * lVar6;
      vptr = (void *)((long)vptr + 8);
    }
  }
  if (local_3c != 0) {
    pnga_pgroup_sync(p_Var9[lVar11].grp);
  }
  return;
}

Assistant:

void pnga_sprs_array_scale(Integer s_a, void *scale)
{
  Integer hdl_a = s_a+GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer s_lo, s_hi;
  Integer ld;
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);
  pnga_distribution(SPA[hdl_a].g_data,me,&s_lo,&s_hi);
  pnga_access_ptr(SPA[hdl_a].g_data,&s_lo,&s_hi,&vptr,&ld);
  if (SPA[hdl_a].type == C_INT) {
    SPRS_REAL_SCALE_M(int,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONG) {
    SPRS_REAL_SCALE_M(long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONGLONG) {
    SPRS_REAL_SCALE_M(long long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_FLOAT) {
    SPRS_REAL_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DBL) {
    SPRS_REAL_SCALE_M(double,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_SCPL) {
    SPRS_COMPLEX_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DCPL) {
    SPRS_COMPLEX_SCALE_M(double,vptr,s_lo,s_hi,scale);
  }

  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
}